

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rest.cpp
# Opt level: O3

bool rest_block_filter(any *context,HTTPRequest *req,string *strURIPart)

{
  pointer pcVar1;
  uint uVar2;
  string key;
  UniValue val;
  span<const_std::byte,_18446744073709551615UL> reply;
  span<const_std::byte,_18446744073709551615UL> reply_00;
  bool bVar3;
  char cVar4;
  RESTResponseFormat RVar5;
  BlockFilterIndex *this;
  ChainstateManager *pCVar6;
  CBlockIndex *block_index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  char *pcVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  char *__s;
  undefined8 uVar11;
  _Alloc_hider _Var12;
  char *in_R8;
  long in_FS_OFFSET;
  byte bVar13;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  string_view str;
  span<const_std::byte,_18446744073709551615UL> reply_01;
  string_view separators;
  BlockFilterType filtertype;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uri_parts;
  string errmsg;
  string strHex;
  BlockFilter filter;
  optional<uint256> block_hash;
  string param;
  undefined1 in_stack_fffffffffffffcb8 [13];
  BlockFilterType in_stack_fffffffffffffcc7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcc8;
  pointer in_stack_fffffffffffffcd0;
  pointer in_stack_fffffffffffffcd8;
  _Alloc_hider in_stack_fffffffffffffce0;
  size_type in_stack_fffffffffffffce8;
  undefined8 in_stack_fffffffffffffcf0;
  undefined8 in_stack_fffffffffffffcf8;
  undefined1 in_stack_fffffffffffffd00 [48];
  long *local_2a8 [2];
  long local_298 [2];
  undefined1 *local_288;
  undefined8 local_280;
  undefined1 local_278 [9];
  undefined4 local_26f;
  undefined2 local_26b;
  char local_269;
  undefined1 local_268 [20];
  undefined4 uStack_254;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_250;
  pointer local_240;
  pointer pbStack_238;
  pointer local_230;
  pointer pUStack_228;
  pointer local_220;
  pointer pUStack_218;
  string local_208;
  undefined1 local_1e8 [32];
  string local_1c8;
  string local_1a8;
  BlockFilter local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  optional<uint256> local_99;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = CheckWarmup(req);
  if (!bVar3) {
    bVar3 = false;
    goto LAB_0098195e;
  }
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  RVar5 = ParseDataFormat(&local_58,strURIPart);
  local_188.m_filter_type = (BlockFilterType)local_58._M_dataplus._M_p;
  local_188.m_block_hash.super_base_blob<256U>.m_data._M_elems._0_7_ =
       SUB87((ulong)local_58._M_dataplus._M_p >> 8,0);
  local_188.m_block_hash.super_base_blob<256U>.m_data._M_elems[7] = (uchar)local_58._M_string_length
  ;
  local_188.m_block_hash.super_base_blob<256U>.m_data._M_elems._8_7_ =
       SUB87(local_58._M_string_length >> 8,0);
  local_268[0] = 0x2f;
  separators._M_str = in_R8;
  separators._M_len = (size_t)local_268;
  util::Split<std::__cxx11::string>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&stack0xfffffffffffffcc8,(util *)&local_188,(Span<const_char> *)0x1,separators);
  if ((long)in_stack_fffffffffffffcd0 - (long)in_stack_fffffffffffffcc8 == 0x40) {
    str._M_str = (char *)0x40;
    str._M_len = (size_t)in_stack_fffffffffffffcc8[1]._M_dataplus._M_p;
    detail::FromHex<uint256>(&local_99,(detail *)in_stack_fffffffffffffcc8[1]._M_string_length,str);
    if (local_99.super__Optional_base<uint256,_true,_true>._M_payload.
        super__Optional_payload_base<uint256>._M_engaged == false) {
      std::operator+(&local_c0,"Invalid hash: ",in_stack_fffffffffffffcc8 + 1);
      RESTERR(req,HTTP_BAD_REQUEST,&local_c0);
      local_78.field_2._M_allocated_capacity = local_c0.field_2._M_allocated_capacity;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) goto LAB_0098192d;
      goto LAB_00981935;
    }
    bVar3 = BlockFilterTypeByName(in_stack_fffffffffffffcc8,&stack0xfffffffffffffcc7);
    if (!bVar3) {
      std::operator+(&local_e0,"Unknown filtertype ",in_stack_fffffffffffffcc8);
      RESTERR(req,HTTP_BAD_REQUEST,&local_e0);
      local_78.field_2._M_allocated_capacity = local_e0.field_2._M_allocated_capacity;
      local_c0._M_dataplus._M_p = local_e0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) goto LAB_0098192d;
      goto LAB_00981935;
    }
    this = GetBlockFilterIndex(in_stack_fffffffffffffcc7);
    if (this == (BlockFilterIndex *)0x0) {
      std::operator+(&local_100,"Index is not enabled for filtertype ",in_stack_fffffffffffffcc8);
      RESTERR(req,HTTP_BAD_REQUEST,&local_100);
      local_78.field_2._M_allocated_capacity = local_100.field_2._M_allocated_capacity;
      local_c0._M_dataplus._M_p = local_100._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) goto LAB_0098192d;
      goto LAB_00981935;
    }
    pCVar6 = GetChainman(context,req);
    if (pCVar6 == (ChainstateManager *)0x0) goto LAB_00981935;
    local_188.m_filter_type = 0x40;
    local_188.m_block_hash.super_base_blob<256U>.m_data._M_elems[0] = 0xc5;
    local_188.m_block_hash.super_base_blob<256U>.m_data._M_elems[1] = '9';
    local_188.m_block_hash.super_base_blob<256U>.m_data._M_elems[2] = '\x01';
    local_188.m_block_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    local_188.m_block_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    local_188.m_block_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    local_188.m_block_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    local_188.m_block_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&local_188);
    block_index = node::BlockManager::LookupBlockIndex(&pCVar6->m_blockman,(uint256 *)&local_99);
    if (block_index == (CBlockIndex *)0x0) {
      std::operator+(&local_120,in_stack_fffffffffffffcc8 + 1," not found");
      RESTERR(req,HTTP_NOT_FOUND,&local_120);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)&local_188);
      goto LAB_00981935;
    }
    uVar2 = block_index->nStatus;
    bVar13 = 4 < (uVar2 & 7);
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&local_188);
    cVar4 = BaseIndex::BlockUntilSyncedToCurrentChain(&this->super_BaseIndex);
    local_188.m_filter_type = INVALID;
    local_188.m_block_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    local_188.m_block_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    local_188.m_block_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    local_188.m_block_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    local_188.m_block_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    local_188.m_block_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    local_188.m_block_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    local_188.m_block_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    local_188.m_block_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    local_188.m_block_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    local_188.m_block_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    local_188.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    local_188.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    local_188.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    local_188.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    local_188.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    local_188.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    local_188.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    local_188.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    local_188.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    local_188.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    local_188.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    local_188.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    local_188.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    local_188.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    local_188.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    local_188.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    local_188.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    local_188.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    local_188.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    local_188.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    local_188.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    local_268._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_268._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_268._16_4_ = local_268._16_4_ & 0xffffff00;
    uStack_254 = 1;
    GCSFilter::GCSFilter(&local_188.m_filter,(Params *)local_268);
    bVar3 = BlockFilterIndex::LookupFilter(this,block_index,&local_188);
    if (bVar3) {
      if (RVar5 == JSON) {
        local_288 = local_278;
        local_268._8_8_ = &aStack_250;
        local_268._0_4_ = 1;
        aStack_250._M_local_buf[0] = '\0';
        aStack_250._1_7_ = (undefined7)local_278._1_8_;
        aStack_250._M_local_buf[8] = SUB81(local_278._1_8_,7);
        aStack_250._9_4_ = local_26f;
        aStack_250._13_2_ = local_26b;
        aStack_250._M_local_buf[0xf] = local_269;
        stack0xfffffffffffffda8 = (pointer)0x0;
        local_280 = 0;
        local_278[0] = 0;
        local_240 = (pointer)0x0;
        pbStack_238 = (pointer)0x0;
        local_230 = (pointer)0x0;
        pUStack_228 = (pointer)0x0;
        local_220 = (pointer)0x0;
        pUStack_218 = (pointer)0x0;
        local_2a8[0] = local_298;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"filter","");
        s_00.m_size = (long)local_188.m_filter.m_encoded.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_188.m_filter.m_encoded.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start;
        s_00.m_data = local_188.m_filter.m_encoded.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start;
        HexStr_abi_cxx11_(&local_1c8,s_00);
        UniValue::
        UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ((UniValue *)&stack0xfffffffffffffd00,&local_1c8);
        key._M_string_length._5_1_ = cVar4;
        key._0_13_ = in_stack_fffffffffffffcb8;
        key._M_string_length._6_1_ = bVar13;
        key._M_string_length._7_1_ = in_stack_fffffffffffffcc7;
        key.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffcc8;
        key.field_2._8_8_ = in_stack_fffffffffffffcd0;
        val.val._M_dataplus._M_p = in_stack_fffffffffffffce0._M_p;
        val._0_8_ = in_stack_fffffffffffffcd8;
        val.val._M_string_length = in_stack_fffffffffffffce8;
        val.val.field_2._M_allocated_capacity = in_stack_fffffffffffffcf0;
        val.val.field_2._8_8_ = in_stack_fffffffffffffcf8;
        val.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data =
             (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )in_stack_fffffffffffffd00._0_24_;
        val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data =
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffffd00._24_24_;
        UniValue::pushKV((UniValue *)local_268,key,val);
        UniValue::~UniValue((UniValue *)&stack0xfffffffffffffd00);
        paVar9 = &local_1c8.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != paVar9) {
          operator_delete(local_1c8._M_dataplus._M_p,
                          (ulong)(local_1c8.field_2._M_allocated_capacity + 1));
        }
        if (local_2a8[0] != local_298) {
          operator_delete(local_2a8[0],local_298[0] + 1);
        }
        UniValue::write_abi_cxx11_((UniValue *)local_1e8,(int)local_268,(void *)0x0,0);
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_1e8,"\n");
        local_1c8._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
        paVar10 = &pbVar7->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p == paVar10) {
          local_1c8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
          local_1c8.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
          local_1c8._M_dataplus._M_p = (pointer)paVar9;
        }
        else {
          local_1c8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        }
        local_1c8._M_string_length = pbVar7->_M_string_length;
        (pbVar7->_M_dataplus)._M_p = (pointer)paVar10;
        pbVar7->_M_string_length = 0;
        (pbVar7->field_2)._M_local_buf[0] = '\0';
        pcVar1 = local_1e8 + 0x10;
        if ((pointer)local_1e8._0_8_ != pcVar1) {
          operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
        }
        local_1e8._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"Content-Type","");
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"application/json","");
        HTTPRequest::WriteHeader(req,(string *)local_1e8,&local_208);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_1e8._0_8_ != pcVar1) {
          operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
        }
        reply_00._M_extent._M_extent_value = local_1c8._M_string_length;
        reply_00._M_ptr = (pointer)local_1c8._M_dataplus._M_p;
        HTTPRequest::WriteReply(req,200,reply_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != paVar9) {
          operator_delete(local_1c8._M_dataplus._M_p,
                          (ulong)(local_1c8.field_2._M_allocated_capacity + 1));
        }
        UniValue::~UniValue((UniValue *)local_268);
      }
      else {
        if (RVar5 == HEX) {
          stack0xfffffffffffffda8 = (pointer)0x0;
          aStack_250._M_local_buf[0] = '\0';
          aStack_250._1_7_ = 0;
          local_268._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_268._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          BlockFilter::Serialize<DataStream>(&local_188,(DataStream *)local_268);
          s.m_data = (pointer)(local_268._0_8_ +
                              CONCAT71(aStack_250._1_7_,aStack_250._M_local_buf[0]));
          s.m_size = local_268._8_8_ - (long)s.m_data;
          HexStr_abi_cxx11_((string *)local_1e8,s);
          pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_1e8,"\n");
          local_1c8._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
          paVar9 = &pbVar7->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p == paVar9) {
            local_1c8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_1c8.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
            local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
          }
          else {
            local_1c8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          }
          local_1c8._M_string_length = pbVar7->_M_string_length;
          (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar7->_M_string_length = 0;
          (pbVar7->field_2)._M_local_buf[0] = '\0';
          pcVar1 = local_1e8 + 0x10;
          if ((pointer)local_1e8._0_8_ != pcVar1) {
            operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
          }
          local_1e8._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"Content-Type","");
          local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"text/plain","");
          HTTPRequest::WriteHeader(req,(string *)local_1e8,&local_208);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
          }
          if ((pointer)local_1e8._0_8_ != pcVar1) {
            operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
          }
          reply._M_extent._M_extent_value = local_1c8._M_string_length;
          reply._M_ptr = (pointer)local_1c8._M_dataplus._M_p;
          HTTPRequest::WriteReply(req,200,reply);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,
                            (ulong)(local_1c8.field_2._M_allocated_capacity + 1));
          }
        }
        else {
          if (RVar5 != BINARY) {
            AvailableDataFormatsString_abi_cxx11_();
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_268,"output format not found (available: ",&local_1c8);
            pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_268,")");
            _Var12._M_p = (pbVar7->_M_dataplus)._M_p;
            paVar9 = &pbVar7->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var12._M_p == paVar9) {
              uVar11 = paVar9->_M_allocated_capacity;
              _Var12._M_p = &stack0xfffffffffffffcf0;
            }
            else {
              uVar11 = paVar9->_M_allocated_capacity;
            }
            (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
            pbVar7->_M_string_length = 0;
            (pbVar7->field_2)._M_local_buf[0] = '\0';
            RESTERR(req,HTTP_NOT_FOUND,(string *)&stack0xfffffffffffffce0);
            if (_Var12._M_p != &stack0xfffffffffffffcf0) {
              operator_delete(_Var12._M_p,uVar11 + 1);
            }
            if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
              operator_delete((void *)local_268._0_8_,(ulong)(stack0xfffffffffffffda8 + 1));
            }
            uVar11 = local_1c8.field_2._M_allocated_capacity;
            _Var12._M_p = local_1c8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) goto LAB_00981abf;
            goto LAB_00981ac7;
          }
          stack0xfffffffffffffda8 = (pointer)0x0;
          aStack_250._M_local_buf[0] = '\0';
          aStack_250._1_7_ = 0;
          local_268._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_268._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          BlockFilter::Serialize<DataStream>(&local_188,(DataStream *)local_268);
          local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"Content-Type","");
          local_1e8._0_8_ = local_1e8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1e8,"application/octet-stream","");
          HTTPRequest::WriteHeader(req,&local_1c8,(string *)local_1e8);
          if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
            operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,
                            (ulong)(local_1c8.field_2._M_allocated_capacity + 1));
          }
          reply_01._M_ptr =
               (pointer)(local_268._0_8_ + CONCAT71(aStack_250._1_7_,aStack_250._M_local_buf[0]));
          reply_01._M_extent._M_extent_value = local_268._8_8_ - (long)reply_01._M_ptr;
          HTTPRequest::WriteReply(req,200,reply_01);
        }
        std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                  ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)local_268);
      }
      bVar3 = true;
    }
    else {
      local_268._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_268 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"Filter not found.","");
      pcVar8 = " Block filters are still in the process of being indexed.";
      if (cVar4 != '\0') {
        pcVar8 = " This error is unexpected and indicates index corruption.";
      }
      __s = " Block was not connected to active chain.";
      if (((uVar2 & 0x60) == 0 & bVar13) != 0) {
        __s = pcVar8;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268,__s)
      ;
      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1a8,local_268._0_8_,(char *)(local_268._8_8_ + local_268._0_8_));
      RESTERR(req,HTTP_NOT_FOUND,&local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      }
      uVar11 = stack0xfffffffffffffda8;
      _Var12._M_p = (pointer)local_268._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_268 + 0x10)) {
LAB_00981abf:
        operator_delete(_Var12._M_p,(ulong)(uVar11 + 1));
      }
LAB_00981ac7:
      bVar3 = false;
    }
    if (local_188.m_filter.m_encoded.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_188.m_filter.m_encoded.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_188.m_filter.m_encoded.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_188.m_filter.m_encoded.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,
               "Invalid URI format. Expected /rest/blockfilter/<filtertype>/<blockhash>","");
    RESTERR(req,HTTP_BAD_REQUEST,&local_78);
    local_c0._M_dataplus._M_p = local_78._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
LAB_0098192d:
      operator_delete(local_c0._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
LAB_00981935:
    bVar3 = false;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xfffffffffffffcc8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
LAB_0098195e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

static bool rest_block_filter(const std::any& context, HTTPRequest* req, const std::string& strURIPart)
{
    if (!CheckWarmup(req)) return false;

    std::string param;
    const RESTResponseFormat rf = ParseDataFormat(param, strURIPart);

    // request is sent over URI scheme /rest/blockfilter/filtertype/blockhash
    std::vector<std::string> uri_parts = SplitString(param, '/');
    if (uri_parts.size() != 2) {
        return RESTERR(req, HTTP_BAD_REQUEST, "Invalid URI format. Expected /rest/blockfilter/<filtertype>/<blockhash>");
    }

    auto block_hash{uint256::FromHex(uri_parts[1])};
    if (!block_hash) {
        return RESTERR(req, HTTP_BAD_REQUEST, "Invalid hash: " + uri_parts[1]);
    }

    BlockFilterType filtertype;
    if (!BlockFilterTypeByName(uri_parts[0], filtertype)) {
        return RESTERR(req, HTTP_BAD_REQUEST, "Unknown filtertype " + uri_parts[0]);
    }

    BlockFilterIndex* index = GetBlockFilterIndex(filtertype);
    if (!index) {
        return RESTERR(req, HTTP_BAD_REQUEST, "Index is not enabled for filtertype " + uri_parts[0]);
    }

    const CBlockIndex* block_index;
    bool block_was_connected;
    {
        ChainstateManager* maybe_chainman = GetChainman(context, req);
        if (!maybe_chainman) return false;
        ChainstateManager& chainman = *maybe_chainman;
        LOCK(cs_main);
        block_index = chainman.m_blockman.LookupBlockIndex(*block_hash);
        if (!block_index) {
            return RESTERR(req, HTTP_NOT_FOUND, uri_parts[1] + " not found");
        }
        block_was_connected = block_index->IsValid(BLOCK_VALID_SCRIPTS);
    }

    bool index_ready = index->BlockUntilSyncedToCurrentChain();

    BlockFilter filter;
    if (!index->LookupFilter(block_index, filter)) {
        std::string errmsg = "Filter not found.";

        if (!block_was_connected) {
            errmsg += " Block was not connected to active chain.";
        } else if (!index_ready) {
            errmsg += " Block filters are still in the process of being indexed.";
        } else {
            errmsg += " This error is unexpected and indicates index corruption.";
        }

        return RESTERR(req, HTTP_NOT_FOUND, errmsg);
    }

    switch (rf) {
    case RESTResponseFormat::BINARY: {
        DataStream ssResp{};
        ssResp << filter;

        req->WriteHeader("Content-Type", "application/octet-stream");
        req->WriteReply(HTTP_OK, ssResp);
        return true;
    }
    case RESTResponseFormat::HEX: {
        DataStream ssResp{};
        ssResp << filter;

        std::string strHex = HexStr(ssResp) + "\n";
        req->WriteHeader("Content-Type", "text/plain");
        req->WriteReply(HTTP_OK, strHex);
        return true;
    }
    case RESTResponseFormat::JSON: {
        UniValue ret(UniValue::VOBJ);
        ret.pushKV("filter", HexStr(filter.GetEncodedFilter()));
        std::string strJSON = ret.write() + "\n";
        req->WriteHeader("Content-Type", "application/json");
        req->WriteReply(HTTP_OK, strJSON);
        return true;
    }
    default: {
        return RESTERR(req, HTTP_NOT_FOUND, "output format not found (available: " + AvailableDataFormatsString() + ")");
    }
    }
}